

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  bool bVar1;
  int iVar2;
  ParameterError PVar3;
  char *__ptr;
  tool_mime *ptVar4;
  long lVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  CURLcode CVar7;
  char *data;
  size_t stdinsize;
  stat sbuf;
  char *local_d8;
  undefined4 local_cc;
  size_t local_c8;
  stat64 local_c0;
  
  uVar6 = CONCAT71(in_register_00000011,isremotefile) & 0xffffffff;
  *errcode = CURLE_OUT_OF_MEMORY;
  iVar2 = strcmp(filename,"-");
  if (iVar2 == 0) {
    iVar2 = fileno(_stdin);
    local_d8 = (char *)0x0;
    lVar5 = ftell(_stdin);
    local_cc = (undefined4)CONCAT71(in_register_00000011,isremotefile);
    if (((lVar5 < 0 || iVar2 < 0) || (iVar2 = fstat64(iVar2,&local_c0), iVar2 != 0)) ||
       ((local_c0.st_mode & 0xf000) != 0x8000)) {
      local_c8 = 0;
      PVar3 = file2memory(&local_d8,&local_c8,(FILE *)_stdin);
      if (PVar3 == PARAM_NO_MEM) {
LAB_0010ecbc:
        CVar7 = CURLE_OK;
        bVar1 = false;
      }
      else {
        CVar7 = CURLE_READ_ERROR;
        if ((PVar3 != PARAM_READ_ERROR) && (CVar7 = CURLE_OK, local_c8 == 0)) {
          local_d8 = strdup("");
          CVar7 = CURLE_OK;
          if (local_d8 == (char *)0x0) goto LAB_0010ecbc;
        }
        uVar6 = local_c8 & 0x7fffffffffffffff;
        bVar1 = true;
        lVar5 = 0;
      }
      if (!bVar1) goto LAB_0010ed2d;
    }
    else {
      CVar7 = CURLE_OK;
      uVar6 = local_c0.st_size - lVar5;
      if (local_c0.st_size - lVar5 < 1) {
        uVar6 = 0;
      }
    }
    ptVar4 = (tool_mime *)calloc(1,0x70);
    if (ptVar4 != (tool_mime *)0x0) {
      ptVar4->kind = TOOLMIME_STDIN;
      ptVar4->parent = parent;
      if (parent != (tool_mime *)0x0) {
        ptVar4->prev = parent->subparts;
        parent->subparts = ptVar4;
      }
      if (ptVar4 != (tool_mime *)0x0) {
        ptVar4->data = local_d8;
        ptVar4->origin = lVar5;
        ptVar4->size = uVar6;
        ptVar4->curpos = 0;
        if ((char)local_cc == '\0') {
          ptVar4->kind = TOOLMIME_STDINDATA;
        }
        *errcode = CVar7;
        return ptVar4;
      }
    }
    free(local_d8);
  }
  else {
    __ptr = strdup(filename);
    if (__ptr != (char *)0x0) {
      ptVar4 = (tool_mime *)calloc(1,0x70);
      if (ptVar4 != (tool_mime *)0x0) {
        ptVar4->kind = TOOLMIME_FILE;
        ptVar4->parent = parent;
        if (parent != (tool_mime *)0x0) {
          ptVar4->prev = parent->subparts;
          parent->subparts = ptVar4;
        }
        if (ptVar4 != (tool_mime *)0x0) {
          ptVar4->data = __ptr;
          if ((char)uVar6 == '\0') {
            ptVar4->kind = TOOLMIME_FILEDATA;
          }
          *errcode = CURLE_OK;
          return ptVar4;
        }
      }
      free(__ptr);
    }
LAB_0010ed2d:
    ptVar4 = (tool_mime *)0x0;
  }
  return ptVar4;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    char *filedup = strdup(filename);
    if(filedup) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        free(filedup);
      else {
        m->data = filedup;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
#ifdef UNDER_CE
    int fd = STDIN_FILENO;
#else
    int fd = fileno(stdin);
#endif
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    CURL_SET_BINMODE(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      switch(file2memory(&data, &stdinsize, stdin)) {
      case PARAM_NO_MEM:
        return m;
      case PARAM_READ_ERROR:
        result = CURLE_READ_ERROR;
        break;
      default:
        if(!stdinsize) {
          /* Zero-length data has been freed. Re-create it. */
          data = strdup("");
          if(!data)
            return m;
        }
        break;
      }
      size = uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      curlx_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}